

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateAnyMethodDefinition
          (MessageGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer *pPVar1;
  bool bVar2;
  LogMessage *pLVar3;
  Sub *local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  undefined1 local_161;
  anon_class_16_2_fd512ddd_for_cb local_160;
  allocator<char> local_149;
  string local_148;
  Sub *local_128;
  Sub local_120;
  iterator local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_58 [2];
  undefined1 local_31;
  LogMessage local_30;
  Voidify local_19;
  Printer *local_18;
  Printer *p_local;
  MessageGenerator *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = IsAnyMessage(this->descriptor_);
  local_31 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
               ,0x6a5,"IsAnyMessage(descriptor_)");
    local_31 = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
  }
  pPVar1 = local_18;
  if ((local_31 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  local_161 = 1;
  local_128 = &local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"any_methods",&local_149);
  local_160.p = &local_18;
  local_160.this = this;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateAnyMethodDefinition(google::protobuf::io::Printer*)::__0>
            (&local_120,&local_148,&local_160);
  local_161 = 0;
  local_68 = &local_120;
  local_60 = 1;
  v._M_len = 1;
  v._M_array = local_68;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_58[0]._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_178,
             "\n        // implements Any\n        // -----------------------------------------------\n\n        $any_methods$;\n\n        template <typename T>\n        bool Is() const {\n          return $pbi$::InternalIs<T>(_internal_type_url());\n        }\n        static bool ParseAnyTypeUrl(\n            //~\n            ::absl::string_view type_url,\n            std::string* $nonnull$ full_type_name);\n      "
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit
            (pPVar1,local_58[0]._M_allocated_capacity,local_58[0]._8_8_,local_178._M_len,
             local_178._M_str);
  local_1b0 = (Sub *)&local_68;
  do {
    local_1b0 = local_1b0 + -1;
    protobuf::io::Printer::Sub::~Sub(local_1b0);
  } while (local_1b0 != &local_120);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  return;
}

Assistant:

void MessageGenerator::GenerateAnyMethodDefinition(io::Printer* p) {
  ABSL_DCHECK(IsAnyMessage(descriptor_));

  p->Emit(
      {{"any_methods",
        [&] {
          if (HasDescriptorMethods(descriptor_->file(), options_)) {
            p->Emit(
                R"cc(
                  bool PackFrom(const $pb$::Message& message) {
                    $DCHK$_NE(&message, this);
                    return $pbi$::InternalPackFrom(message, mutable_type_url(),
                                                   _internal_mutable_value());
                  }
                  bool PackFrom(const $pb$::Message& message,
                                ::absl::string_view type_url_prefix) {
                    $DCHK$_NE(&message, this);
                    return $pbi$::InternalPackFrom(message, type_url_prefix,
                                                   mutable_type_url(),
                                                   _internal_mutable_value());
                  }
                  bool UnpackTo($pb$::Message* $nonnull$ message) const {
                    return $pbi$::InternalUnpackTo(_internal_type_url(),
                                                   _internal_value(), message);
                  }
                  static bool GetAnyFieldDescriptors(
                      const $pb$::Message& message,
                      const $pb$::FieldDescriptor* $nullable$* $nonnull$
                          type_url_field,
                      const $pb$::FieldDescriptor* $nullable$* $nonnull$
                          value_field);
                  template <
                      typename T,
                      class = typename std::enable_if<!std::is_convertible<
                          T, const $pb$::Message&>::value>::type>
                  bool PackFrom(const T& message) {
                    return $pbi$::InternalPackFrom<T>(
                        message, mutable_type_url(), _internal_mutable_value());
                  }
                  template <
                      typename T,
                      class = typename std::enable_if<!std::is_convertible<
                          T, const $pb$::Message&>::value>::type>
                  bool PackFrom(const T& message,
                                ::absl::string_view type_url_prefix) {
                    return $pbi$::InternalPackFrom<T>(
                        message, type_url_prefix, mutable_type_url(),
                        _internal_mutable_value());
                  }
                  template <
                      typename T,
                      class = typename std::enable_if<!std::is_convertible<
                          T, const $pb$::Message&>::value>::type>
                  bool UnpackTo(T* $nonnull$ message) const {
                    return $pbi$::InternalUnpackTo<T>(
                        _internal_type_url(), _internal_value(), message);
                  }
                )cc");
          } else {
            p->Emit(
                R"cc(
                  template <typename T>
                  bool PackFrom(const T& message) {
                    return $pbi$::InternalPackFrom(message, mutable_type_url(),
                                                   _internal_mutable_value());
                  }
                  template <typename T>
                  bool PackFrom(const T& message,
                                ::absl::string_view type_url_prefix) {
                    return $pbi$::InternalPackFrom(message, type_url_prefix,
                                                   mutable_type_url(),
                                                   _internal_mutable_value());
                  }
                  template <typename T>
                  bool UnpackTo(T* $nonnull$ message) const {
                    return $pbi$::InternalUnpackTo(_internal_type_url(),
                                                   _internal_value(), message);
                  }
                )cc");
          }
        }}},
      R"cc(
        // implements Any
        // -----------------------------------------------

        $any_methods$;

        template <typename T>
        bool Is() const {
          return $pbi$::InternalIs<T>(_internal_type_url());
        }
        static bool ParseAnyTypeUrl(
            //~
            ::absl::string_view type_url,
            std::string* $nonnull$ full_type_name);
      )cc");
}